

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O1

int Scl_CommandWriteScl(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *pFVar2;
  size_t __size;
  char *pcVar3;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    if (pAbc->pLibScl != (void *)0x0) {
      pcVar3 = argv[globalUtilOptind];
      pFVar2 = fopen(pcVar3,"wb");
      if (pFVar2 == (FILE *)0x0) {
        fprintf((FILE *)pAbc->Err,"Cannot open output file \"%s\". \n",pcVar3);
        return 1;
      }
      fclose(pFVar2);
      Abc_SclWriteScl(pcVar3,(SC_Lib *)pAbc->pLibScl);
      return 0;
    }
    pFVar2 = (FILE *)pAbc->Err;
    pcVar3 = "There is no Liberty library available.\n";
    __size = 0x27;
  }
  else {
    fwrite("usage: write_scl [-h] <file>\n",0x1d,1,(FILE *)pAbc->Err);
    fwrite("\t         write extracted Liberty library into file\n",0x34,1,(FILE *)pAbc->Err);
    fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
    pFVar2 = (FILE *)pAbc->Err;
    pcVar3 = "\t<file> : the name of the file to write\n";
    __size = 0x28;
  }
  fwrite(pcVar3,__size,1,pFVar2);
  return 1;
}

Assistant:

int Scl_CommandWriteScl( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    char * pFileName;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        return 1;
    }
    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "wb" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open output file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );

    // save current library
    Abc_SclWriteScl( pFileName, (SC_Lib *)pAbc->pLibScl );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_scl [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         write extracted Liberty library into file\n" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\t<file> : the name of the file to write\n" );
    return 1;
}